

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O0

Error asmjit::v1_14::x86::FormatterInternal::formatOperand
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  bool bVar1;
  Error EVar2;
  uint uVar3;
  Error EVar4;
  uint uVar5;
  uint uVar6;
  FormatFlags in_ESI;
  String *in_RDI;
  String *in_R8;
  Error _err_14;
  int64_t val;
  Imm *i;
  Error _err_13;
  Error _err_12;
  uint32_t base;
  Error _err_11;
  uint64_t off;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  FormatFlags modifiedFlags;
  Error _err_5;
  char opSign;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  uint32_t seg;
  Error _err;
  Mem *m;
  char cVar7;
  undefined8 in_stack_fffffffffffffb10;
  ModifyOp MVar8;
  String *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  char *in_stack_fffffffffffffb28;
  ModifyOp in_stack_fffffffffffffb34;
  String *in_stack_fffffffffffffb38;
  String *pSVar9;
  undefined4 local_4b0;
  ulong local_4a8;
  uint local_4a0;
  undefined4 local_49c;
  Error local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined1 local_488 [4];
  undefined4 local_484;
  char local_47d;
  uint32_t in_stack_fffffffffffffb84;
  uint32_t in_stack_fffffffffffffb88;
  undefined2 in_stack_fffffffffffffb8c;
  undefined2 uVar10;
  RegType in_stack_fffffffffffffb8e;
  RegType type;
  Arch in_stack_fffffffffffffb8f;
  Arch arch_00;
  BaseEmitter *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  FormatFlags in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined8 in_stack_fffffffffffffbf0;
  StringFormatFlags flags;
  size_t in_stack_fffffffffffffbf8;
  size_t width;
  undefined8 in_stack_fffffffffffffc00;
  uint32_t uVar11;
  uint64_t in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  ModifyOp op_00;
  char *in_stack_fffffffffffffc18;
  uint local_2c4 [3];
  undefined4 local_2b8;
  uint local_2b4 [10];
  undefined4 local_28c;
  undefined1 *local_288;
  undefined4 local_27c;
  uint local_26c [9];
  uint *local_248;
  char *local_240;
  uint local_21c [4];
  undefined4 local_20c;
  undefined8 local_208;
  undefined4 local_1fc;
  String *local_1f8;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined4 local_1d4;
  ulong local_1d0;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined4 local_194;
  String *local_190;
  undefined4 local_ec;
  uint local_e0;
  undefined4 local_dc;
  uint local_d0;
  undefined4 local_cc;
  uint local_c0;
  undefined4 local_bc;
  uint *local_b8;
  undefined4 local_ac;
  uint *local_a8;
  undefined4 local_9c;
  uint *local_98;
  undefined4 local_8c;
  uint local_7c;
  undefined4 *local_78;
  uint *local_70;
  undefined1 local_65;
  undefined4 local_64;
  undefined4 local_8;
  undefined4 local_4;
  
  uVar11 = (uint32_t)((ulong)in_stack_fffffffffffffc00 >> 0x20);
  flags = (StringFormatFlags)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  op_00 = (ModifyOp)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  if ((*(uint *)in_R8 & 7) == 1) {
    EVar2 = formatRegister((String *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90,
                           in_stack_fffffffffffffb8f,in_stack_fffffffffffffb8e,
                           in_stack_fffffffffffffb88);
    return EVar2;
  }
  if ((*(uint *)in_R8 & 7) != 2) {
    if ((*(uint *)in_R8 & 7) != 4) {
      if ((*(uint *)in_R8 & 7) == 5) {
        EVar2 = Formatter::formatLabel
                          ((String *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                           (FormatFlags)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                           (BaseEmitter *)
                           CONCAT17(in_stack_fffffffffffffb8f,
                                    CONCAT16(in_stack_fffffffffffffb8e,
                                             CONCAT24(in_stack_fffffffffffffb8c,
                                                      in_stack_fffffffffffffb88))),
                           in_stack_fffffffffffffb84);
        return EVar2;
      }
      EVar2 = String::_opString(in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,
                                in_stack_fffffffffffffb28,
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      return EVar2;
    }
    pSVar9 = *(String **)(in_R8 + 8);
    bVar1 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(in_ESI,kHexImms);
    if ((bVar1) && ((String *)0x9 < pSVar9)) {
      uVar11 = 0;
      width = 2;
      EVar2 = String::_opString(pSVar9,in_stack_fffffffffffffb34,in_stack_fffffffffffffb28,
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      if (EVar2 != 0) {
        return EVar2;
      }
      local_1fc = 0x10;
      local_208 = 0;
      local_20c = 0;
      local_1f8 = pSVar9;
      EVar2 = String::_opNumber((String *)in_stack_fffffffffffffc18,op_00,(uint64_t)in_RDI,uVar11,
                                width,flags);
      return EVar2;
    }
    local_194 = 10;
    local_1a0 = 0;
    local_1a4 = 0;
    local_4 = 0;
    local_8 = 0x80000000;
    local_190 = pSVar9;
    EVar2 = String::_opNumber((String *)in_stack_fffffffffffffc18,op_00,in_stack_fffffffffffffc08,
                              uVar11,in_stack_fffffffffffffbf8,flags);
    return EVar2;
  }
  pSVar9 = in_RDI;
  x86GetAddressSizeString(*(uint *)in_R8 >> 0x18);
  EVar2 = String::_opString(in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,(char *)in_RDI,
                            CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar3 = *(uint *)in_R8 >> 0x12 & 7;
  if ((uVar3 != 0) && (uVar3 < 7)) {
    in_stack_fffffffffffffb90 = (BaseEmitter *)(x86RegFormatInfo + (ulong)uVar3 * 4 + 0x1e0);
    EVar4 = String::_opFormat(pSVar9,kAppend,"%s:",in_stack_fffffffffffffb90);
    if (EVar4 != 0) {
      return EVar4;
    }
    in_stack_fffffffffffffb9c = kNone;
  }
  MVar8 = (ModifyOp)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  cVar7 = (char)((ulong)in_stack_fffffffffffffb10 >> 0x18);
  EVar4 = String::_opChar(in_stack_fffffffffffffb18,MVar8,cVar7);
  uVar10 = (undefined2)EVar4;
  type = (RegType)(EVar4 >> 0x10);
  arch_00 = (Arch)(EVar4 >> 0x18);
  if (EVar4 != 0) {
    return EVar4;
  }
  uVar5 = *(uint *)in_R8 >> 0xe;
  uVar6 = uVar5 & 3;
  if (uVar6 != 0) {
    if (uVar6 == 1) {
      EVar4 = String::_opString(in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,(char *)in_RDI,
                                CONCAT44(uVar5,in_stack_fffffffffffffb20) & 0x3ffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      in_stack_fffffffffffffb88 = 0;
    }
    else if (uVar6 == 2) {
      EVar4 = String::_opString(in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,(char *)in_RDI,
                                CONCAT44(uVar5,in_stack_fffffffffffffb20) & 0x3ffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      in_stack_fffffffffffffb84 = 0;
    }
  }
  local_47d = '\0';
  local_cc = 0xf8;
  local_2c4[0] = *(uint *)in_R8 & 0xf8;
  local_98 = local_2c4;
  local_9c = 0;
  local_c0 = local_2c4[0];
  if (local_2c4[0] != 0) {
    local_47d = '+';
    local_8c = 0xf8;
    local_2b4[0] = *(uint *)in_R8 & 0xf8;
    local_65 = 1;
    local_2b8 = 8;
    local_70 = local_2b4;
    local_78 = &local_2b8;
    local_7c = local_2b4[0];
    local_64 = local_2b8;
    if (local_2b4[0] == 8) {
      EVar4 = Formatter::formatLabel
                        ((String *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (FormatFlags)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                         (BaseEmitter *)
                         CONCAT17(arch_00,CONCAT16(type,CONCAT24(uVar10,in_stack_fffffffffffffb88)))
                         ,in_stack_fffffffffffffb84);
      if (EVar4 != 0) {
        return EVar4;
      }
      local_484 = 0;
    }
    else {
      if ((*(uint *)in_R8 & 0x2000) != 0) {
        EVar4 = String::_opString(in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,(char *)in_RDI
                                  ,CONCAT44(uVar6,in_stack_fffffffffffffb20));
        if (EVar4 != 0) {
          return EVar4;
        }
        local_27c = 0x10;
        local_28c = 0xffffffef;
        local_288 = local_488;
        local_48c = 0;
      }
      EVar4 = formatRegister((String *)CONCAT44(EVar2,uVar3),in_stack_fffffffffffffb9c,
                             in_stack_fffffffffffffb90,arch_00,type,in_stack_fffffffffffffb88);
      if (EVar4 != 0) {
        return EVar4;
      }
      local_490 = 0;
    }
  }
  local_dc = 0x1f00;
  local_26c[0] = *(uint *)in_R8 & 0x1f00;
  local_a8 = local_26c;
  local_ac = 0;
  local_d0 = local_26c[0];
  if (local_26c[0] != 0) {
    if (local_47d != '\0') {
      EVar4 = String::_opChar(in_stack_fffffffffffffb18,MVar8,cVar7);
      if (EVar4 != 0) {
        return EVar4;
      }
      local_494 = 0;
    }
    local_47d = '+';
    local_498 = formatRegister((String *)CONCAT44(EVar2,uVar3),in_stack_fffffffffffffb9c,
                               in_stack_fffffffffffffb90,arch_00,type,in_stack_fffffffffffffb88);
    if (local_498 != 0) {
      return local_498;
    }
    if ((*(uint *)in_R8 & 0x30000) != 0) {
      local_4a0 = 1 << ((byte)((uint)*(undefined4 *)in_R8 >> 0x10) & 3);
      local_240 = "*%u";
      local_248 = &local_4a0;
      EVar2 = String::_opFormat(pSVar9,kAppend,"*%u",(ulong)local_4a0);
      if (EVar2 != 0) {
        return EVar2;
      }
      local_49c = 0;
    }
  }
  if ((*(uint *)in_R8 >> 3 & 0x1f) == 0) {
    local_4a8 = CONCAT44(*(undefined4 *)(in_R8 + 4),*(undefined4 *)(in_R8 + 0xc));
  }
  else {
    local_4a8 = (ulong)*(int *)(in_R8 + 0xc);
  }
  cVar7 = (char)(local_4a8 >> 0x18);
  MVar8 = (ModifyOp)(local_4a8 >> 0x20);
  if (local_4a8 == 0) {
    local_ec = 0x1ff8;
    local_21c[0] = *(uint *)in_R8 & 0x1ff8;
    local_b8 = local_21c;
    local_bc = 0;
    local_e0 = local_21c[0];
    if (local_21c[0] != 0) goto LAB_001d166e;
  }
  if ((long)local_4a8 < 0) {
    local_47d = '-';
    local_4a8 = (local_4a8 ^ 0xffffffffffffffff) + 1;
  }
  if ((local_47d != '\0') && (EVar2 = String::_opChar(in_R8,MVar8,cVar7), EVar2 != 0)) {
    return EVar2;
  }
  local_4b0 = 10;
  bVar1 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(in_ESI,kHexOffsets);
  if ((bVar1) && (9 < local_4a8)) {
    in_stack_fffffffffffffc18 = "0x";
    op_00 = kAssign;
    EVar2 = String::_opString(in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,(char *)in_RDI,
                              CONCAT44(uVar6,in_stack_fffffffffffffb20));
    if (EVar2 != 0) {
      return EVar2;
    }
    local_4b0 = 0x10;
  }
  local_1d0 = local_4a8;
  local_1d4 = local_4b0;
  local_1e0 = 0;
  local_1e4 = 0;
  EVar2 = String::_opNumber((String *)in_stack_fffffffffffffc18,op_00,in_stack_fffffffffffffc08,
                            uVar11,in_stack_fffffffffffffbf8,flags);
  if (EVar2 != 0) {
    return EVar2;
  }
LAB_001d166e:
  EVar2 = String::_opChar(in_R8,MVar8,cVar7);
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatOperand(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

  if (op.isReg())
    return formatRegister(sb, formatFlags, emitter, arch, op.as<BaseReg>().type(), op.as<BaseReg>().id());

  if (op.isMem()) {
    const Mem& m = op.as<Mem>();
    ASMJIT_PROPAGATE(sb.append(x86GetAddressSizeString(m.size())));

    // Segment override prefix.
    uint32_t seg = m.segmentId();
    if (seg != SReg::kIdNone && seg < SReg::kIdCount)
      ASMJIT_PROPAGATE(sb.appendFormat("%s:", x86RegFormatInfo.nameStrings + 224 + size_t(seg) * 4));

    ASMJIT_PROPAGATE(sb.append('['));
    switch (m.addrType()) {
      case Mem::AddrType::kDefault:
        break;
      case Mem::AddrType::kAbs:
        ASMJIT_PROPAGATE(sb.append("abs "));
        break;
      case Mem::AddrType::kRel:
        ASMJIT_PROPAGATE(sb.append("rel "));
        break;
    }

    char opSign = '\0';
    if (m.hasBase()) {
      opSign = '+';
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Formatter::formatLabel(sb, formatFlags, emitter, m.baseId()));
      }
      else {
        FormatFlags modifiedFlags = formatFlags;
        if (m.isRegHome()) {
          ASMJIT_PROPAGATE(sb.append("&"));
          modifiedFlags &= ~FormatFlags::kRegCasts;
        }
        ASMJIT_PROPAGATE(formatRegister(sb, modifiedFlags, emitter, arch, m.baseType(), m.baseId()));
      }
    }

    if (m.hasIndex()) {
      if (opSign)
        ASMJIT_PROPAGATE(sb.append(opSign));

      opSign = '+';
      ASMJIT_PROPAGATE(formatRegister(sb, formatFlags, emitter, arch, m.indexType(), m.indexId()));
      if (m.hasShift())
        ASMJIT_PROPAGATE(sb.appendFormat("*%u", 1 << m.shift()));
    }

    uint64_t off = uint64_t(m.offset());
    if (off || !m.hasBaseOrIndex()) {
      if (int64_t(off) < 0) {
        opSign = '-';
        off = ~off + 1;
      }

      if (opSign)
        ASMJIT_PROPAGATE(sb.append(opSign));

      uint32_t base = 10;
      if (Support::test(formatFlags, FormatFlags::kHexOffsets) && off > 9) {
        ASMJIT_PROPAGATE(sb.append("0x", 2));
        base = 16;
      }

      ASMJIT_PROPAGATE(sb.appendUInt(off, base));
    }

    return sb.append(']');
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.value();

    if (Support::test(formatFlags, FormatFlags::kHexImms) && uint64_t(val) > 9) {
      ASMJIT_PROPAGATE(sb.append("0x", 2));
      return sb.appendUInt(uint64_t(val), 16);
    }
    else {
      return sb.appendInt(val, 10);
    }
  }

  if (op.isLabel()) {
    return Formatter::formatLabel(sb, formatFlags, emitter, op.id());
  }

  return sb.append("<None>");
}